

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O1

double incirclefast(double *pa,double *pb,double *pc,double *pd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = *pd;
  dVar4 = pd[1];
  dVar3 = *pa - dVar1;
  dVar5 = pa[1] - dVar4;
  dVar2 = *pb - dVar1;
  dVar6 = pb[1] - dVar4;
  dVar1 = *pc - dVar1;
  dVar4 = pc[1] - dVar4;
  return (dVar1 * dVar1 + dVar4 * dVar4) * (dVar3 * dVar6 - dVar5 * dVar2) +
         (dVar2 * dVar2 + dVar6 * dVar6) * (dVar1 * dVar5 - dVar4 * dVar3) +
         (dVar3 * dVar3 + dVar5 * dVar5) * (dVar2 * dVar4 - dVar6 * dVar1);
}

Assistant:

REAL incirclefast(REAL *pa, REAL *pb, REAL *pc, REAL *pd)
{
  REAL adx, ady, bdx, bdy, cdx, cdy;
  REAL abdet, bcdet, cadet;
  REAL alift, blift, clift;

  adx = pa[0] - pd[0];
  ady = pa[1] - pd[1];
  bdx = pb[0] - pd[0];
  bdy = pb[1] - pd[1];
  cdx = pc[0] - pd[0];
  cdy = pc[1] - pd[1];

  abdet = adx * bdy - bdx * ady;
  bcdet = bdx * cdy - cdx * bdy;
  cadet = cdx * ady - adx * cdy;
  alift = adx * adx + ady * ady;
  blift = bdx * bdx + bdy * bdy;
  clift = cdx * cdx + cdy * cdy;

  return alift * bcdet + blift * cadet + clift * abdet;
}